

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O1

Error __thiscall asmjit::RAPass::process(RAPass *this,Zone *zone)

{
  CodeBuilder *pCVar1;
  Error EVar2;
  CBNode *pCVar3;
  
  this->_zone = zone;
  ZoneHeap::reset(&this->_heap,zone);
  pCVar1 = (this->super_CBPass)._cb;
  this->_emitComments = (byte)(pCVar1->super_CodeEmitter)._globalOptions >> 2 & 1;
  pCVar3 = pCVar1->_firstNode;
  EVar2 = 0;
  if (pCVar3 == (CBNode *)0x0) {
    return 0;
  }
  do {
    if (pCVar3->_type == '\x10') {
      pCVar3 = pCVar3[8]._next;
      EVar2 = (*(this->super_CBPass)._vptr_CBPass[3])(this);
      if (EVar2 != 0) {
LAB_00116b9b:
        ZoneHeap::reset(&this->_heap,(Zone *)0x0);
        this->_zone = (Zone *)0x0;
        return EVar2;
      }
    }
    do {
      pCVar3 = pCVar3->_next;
      if (pCVar3 == (CBNode *)0x0) goto LAB_00116b9b;
    } while (pCVar3->_type != '\x10');
  } while( true );
}

Assistant:

Error RAPass::process(Zone* zone) noexcept {
  _zone = zone;
  _heap.reset(zone);
  _emitComments = (cb()->getGlobalOptions() & CodeEmitter::kOptionLoggingEnabled) != 0;

  Error err = kErrorOk;
  CBNode* node = cc()->getFirstNode();
  if (!node) return err;

  do {
    if (node->getType() == CBNode::kNodeFunc) {
      CCFunc* func = static_cast<CCFunc*>(node);
      node = func->getEnd();

      err = compile(func);
      if (err) break;
    }

    // Find a function by skipping all nodes that are not `kNodeFunc`.
    do {
      node = node->getNext();
    } while (node && node->getType() != CBNode::kNodeFunc);
  } while (node);

  _heap.reset(nullptr);
  _zone = nullptr;
  return err;
}